

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

int duckdb::DecimalScaleDownCheckOperator::Operation<duckdb::hugeint_t,int>
              (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  duckdb *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  undefined7 in_register_00000089;
  hugeint_t value;
  hugeint_t input_00;
  hugeint_t input_01;
  string error;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68 [32];
  string local_48;
  
  input_00.lower = input.upper;
  this = (duckdb *)input.lower;
  input_00.upper = (int64_t)dataptr;
  bVar1 = CanScaleDownDecimal<duckdb::hugeint_t>
                    (this,input_00,(DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> *)idx);
  if (bVar1) {
    input_01.upper = (int64_t)mask;
    input_01.lower = input_00.lower;
    iVar2 = DecimalScaleDownOperator::Operation<duckdb::hugeint_t,int>
                      ((DecimalScaleDownOperator *)this,input_01,(ValidityMask *)idx,(idx_t)dataptr,
                       (void *)CONCAT71(in_register_00000089,in_R9B));
    return iVar2;
  }
  ::std::__cxx11::string::string
            (local_68,"Casting value \"%s\" to type %s failed: value is out of range!",&local_a9);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x41);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x40);
  value.lower = input_00.lower;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_88,(Decimal *)this,value,*(byte *)((long)dataptr + 0x41),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_a8,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,(StringUtil *)local_68,&local_88,&local_a8,params_1);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string(local_68);
  iVar2 = HandleVectorCastError::Operation<int>
                    (&local_48,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  ::std::__cxx11::string::~string((string *)&local_48);
  return iVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = static_cast<DecimalScaleInput<INPUT_TYPE> *>(dataptr);
		if (!CanScaleDownDecimal(input, *data)) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return DecimalScaleDownOperator::Operation<INPUT_TYPE, RESULT_TYPE>(input, mask, idx, dataptr);
	}